

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O3

bool utils::inputWaiting(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  timeval tv;
  fd_set fds;
  timeval local_b8;
  fd_set local_a8;
  
  local_b8.tv_sec = 0;
  local_b8.tv_usec = 1;
  local_a8.fds_bits[0] = 0;
  local_a8.fds_bits[1] = 0;
  local_a8.fds_bits[2] = 0;
  local_a8.fds_bits[3] = 0;
  local_a8.fds_bits[4] = 0;
  local_a8.fds_bits[5] = 0;
  local_a8.fds_bits[6] = 0;
  local_a8.fds_bits[7] = 0;
  local_a8.fds_bits[8] = 0;
  local_a8.fds_bits[9] = 0;
  local_a8.fds_bits[10] = 0;
  local_a8.fds_bits[0xb] = 0;
  local_a8.fds_bits[0xc] = 0;
  local_a8.fds_bits[0xd] = 0;
  local_a8.fds_bits[0xe] = 0;
  local_a8.fds_bits[0xf] = 0;
  iVar1 = fileno(_stdin);
  iVar2 = fileno(_stdin);
  iVar3 = iVar2 + 0x3f;
  if (-1 < iVar2) {
    iVar3 = iVar2;
  }
  local_a8.fds_bits[iVar3 >> 6] = local_a8.fds_bits[iVar3 >> 6] | 1L << ((byte)iVar1 & 0x3f);
  iVar3 = select(0x400,&local_a8,(fd_set *)0x0,(fd_set *)0x0,&local_b8);
  return iVar3 != 0;
}

Assistant:

bool utils::inputWaiting()
{
#ifdef WIN32
    static int init = 0, pipe;
    static HANDLE inh;
    DWORD dw;
    if (!init) {
        init = 1;
        inh = GetStdHandle(STD_INPUT_HANDLE);
        pipe = !GetConsoleMode(inh, &dw);
        if (!pipe) {
            SetConsoleMode(inh, dw & ~(ENABLE_MOUSE_INPUT | ENABLE_WINDOW_INPUT));
            FlushConsoleInputBuffer(inh);
        }
    }
    if (pipe) {
        if (!PeekNamedPipe(inh, NULL, 0, NULL, &dw, NULL)) {
            return 1;
        }
        return dw > 0;
    }
    else {
        GetNumberOfConsoleInputEvents(inh, &dw);
        return dw <= 1 ? false : dw > 0;
    }
#elif __APPLE__
    fd_set fds;
    struct timeval tv;
    FD_ZERO(&fds);
    FD_SET(fileno(stdin), &fds);
    return select(sizeof(fds) * 8, &fds, nullptr, nullptr, &tv);
#else
    fd_set fds;
    struct timeval tv
    {
        0, 1
    };
    FD_ZERO(&fds);
    FD_SET(fileno(stdin), &fds);
    return select(sizeof(fds) * 8, &fds, nullptr, nullptr, &tv);
#endif
}